

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O2

void DumpData(PtexTexture *r,int faceid,bool dumpall)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *__ptr;
  ostream *poVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  int ui;
  uint uVar12;
  uint uVar13;
  PtexReader *R;
  ulong uVar14;
  bool bVar15;
  uint local_64;
  
  uVar9 = 1;
  if (r != (PtexTexture *)0x0 && dumpall) {
    uVar9 = (uint)*(ushort *)((long)&r[0x13]._vptr_PtexTexture + 6);
  }
  iVar4 = (*r->_vptr_PtexTexture[0x10])(r,(ulong)(uint)faceid);
  uVar5 = (*r->_vptr_PtexTexture[0xb])(r);
  __ptr = malloc((long)(int)uVar5 * 4);
  uVar1 = *(ushort *)CONCAT44(extraout_var,iVar4);
  uVar2 = uVar5;
  if ((int)uVar5 < 1) {
    uVar2 = 0;
  }
  local_64 = (uint)(byte)uVar1;
  for (uVar6 = (uint)(uVar1 >> 8);
      ((bVar15 = uVar9 != 0, uVar9 = uVar9 - 1, bVar15 && ('\0' < (char)(byte)local_64)) &&
      ('\0' < (char)(byte)uVar6)); uVar6 = uVar6 - 1) {
    uVar10 = 1 << ((byte)local_64 & 0x1f);
    uVar12 = 1 << ((byte)uVar6 & 0x1f);
    poVar8 = std::operator<<((ostream *)&std::cout,"  data (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar10);
    poVar8 = std::operator<<(poVar8," x ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar12);
    std::operator<<(poVar8,")");
    if ((*(byte *)((long)CONCAT44(extraout_var,iVar4) + 3) & 1) != 0) {
      uVar10 = 1;
      uVar12 = uVar10;
    }
    bVar15 = uVar12 == 1;
    bVar3 = uVar10 == 1;
    pcVar11 = ":";
    if (bVar15 && bVar3) {
      pcVar11 = ", const: ";
    }
    std::operator<<((ostream *)&std::cout,pcVar11);
    if ((int)uVar10 < 1) {
      uVar10 = 0;
    }
    if ((int)uVar12 < 1) {
      uVar12 = 0;
    }
    for (uVar7 = 0; uVar7 != uVar12; uVar7 = uVar7 + 1) {
      uVar14 = 0;
      while (uVar13 = (uint)uVar14, uVar13 != uVar10) {
        if (!bVar15 || !bVar3) {
          poVar8 = std::operator<<((ostream *)&std::cout,"\n    (");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar13);
          poVar8 = std::operator<<(poVar8,", ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar7);
          std::operator<<(poVar8,"): ");
        }
        (*r->_vptr_PtexTexture[0x16])
                  (r,(ulong)(uint)faceid,uVar14,(ulong)uVar7,__ptr,0,CONCAT44(extraout_var_00,uVar5)
                   ,(ulong)(uVar6 << 8 | local_64));
        for (uVar14 = 0; uVar2 != uVar14; uVar14 = uVar14 + 1) {
          printf(" %.3f",(double)*(float *)((long)__ptr + uVar14 * 4));
        }
        uVar14 = (ulong)(uVar13 + 1);
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    local_64 = local_64 - 1;
  }
  free(__ptr);
  return;
}

Assistant:

void DumpData(PtexTexture* r, int faceid, bool dumpall)
{
    int levels = 1;
    if (dumpall) {
        PtexReader* R = static_cast<PtexReader*> (r);
        if (R) levels = R->header().nlevels;
    }

    const Ptex::FaceInfo& f = r->getFaceInfo(faceid);
    int nchan = r->numChannels();
    float* pixel = (float*) malloc(sizeof(float)*nchan);
    Ptex::Res res = f.res;
    while (levels && res.ulog2 >= 1 && res.vlog2 >= 1) {
        int ures = res.u(), vres = res.v();
        std::cout << "  data (" << ures << " x " << vres << ")";
        if (f.isConstant()) { ures = vres = 1; }
        bool isconst = (ures == 1 && vres == 1);
        if (isconst) std::cout << ", const: ";
        else std::cout << ":";
        for (int vi = 0; vi < vres; vi++) {
            for (int ui = 0; ui < ures; ui++) {
                if (!isconst) std::cout << "\n    (" << ui << ", " << vi << "): ";
                r->getPixel(faceid, ui, vi, pixel, 0, nchan, res);
                for (int c=0; c < nchan; c++) {
                    printf(" %.3f", pixel[c]);
                }
            }
        }
        std::cout << std::endl;
        res.ulog2--;
        res.vlog2--;
        levels--;
    }
    free(pixel);
}